

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_Forward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar2;
  int64_t i;
  long lVar3;
  int64_t c;
  long lVar4;
  int64_t r;
  long lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  complex<double> pivot;
  
  lVar5 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    lVar5 = 0;
    while( true ) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      if (CONCAT44(extraout_var_00,iVar1) <= lVar5) break;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
      pivot._M_value._8_8_ = in_XMM1_Qa;
      for (lVar4 = 0; lVar4 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
          lVar4 = lVar4 + 1) {
        local_58 = 0.0;
        dStack_50 = 0.0;
        for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar3);
          local_68._8_8_ = in_XMM1_Qa;
          (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(B,lVar3,lVar4);
          local_78 = extraout_XMM0_Qa;
          dStack_70 = in_XMM1_Qa;
          std::operator*((complex<double> *)local_68,(complex<double> *)&local_78);
          local_58 = local_58 + extraout_XMM0_Qa_00;
          dStack_50 = dStack_50 + in_XMM1_Qa;
          in_XMM1_Qa = local_58;
        }
        (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(B,lVar5,lVar4);
        local_78 = extraout_XMM0_Qa_01 - local_58;
        dStack_70 = in_XMM1_Qa - dStack_50;
        std::operator/((complex<double> *)&local_78,&pivot);
        local_68._8_8_ = in_XMM1_Qa;
        (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(B,lVar5,lVar4,(complex<double> *)local_68);
      }
      lVar5 = lVar5 + 1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}